

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpd.cpp
# Opt level: O0

void __thiscall xmrig::Httpd::onHttpData(Httpd *this,HttpData *data)

{
  undefined *puVar1;
  bool bVar2;
  int iVar3;
  Config *this_00;
  Http *this_01;
  size_type sVar4;
  mapped_type *pmVar5;
  HttpData *in_RSI;
  long in_RDI;
  int status;
  char *in_stack_fffffffffffffb98;
  HttpApiResponse *in_stack_fffffffffffffba0;
  HttpApiResponse *this_02;
  undefined6 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbae;
  undefined1 in_stack_fffffffffffffbaf;
  HttpApiResponse *in_stack_fffffffffffffbb0;
  key_type *in_stack_fffffffffffffbb8;
  HttpApiResponse *in_stack_fffffffffffffbc0;
  byte local_429;
  HttpData *in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [16];
  HttpData *in_stack_fffffffffffffd08;
  Api *in_stack_fffffffffffffd10;
  HttpApiResponse *in_stack_fffffffffffffe10;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  HttpResponse *in_stack_ffffffffffffffb0;
  
  if (in_RSI->method == 6) {
    HttpData::id(in_RSI);
    HttpApiResponse::HttpApiResponse
              (in_stack_fffffffffffffbb0,
               CONCAT17(in_stack_fffffffffffffbaf,
                        CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)));
    HttpApiResponse::end(in_stack_fffffffffffffe10);
    HttpApiResponse::~HttpApiResponse(in_stack_fffffffffffffba0);
  }
  else if ((in_RSI->method == 1) &&
          (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98), bVar2))
  {
    HttpData::id(in_RSI);
    HttpResponse::HttpResponse
              (&in_stack_fffffffffffffba0->super_HttpResponse,(uint64_t)in_stack_fffffffffffffb98,0)
    ;
    HttpResponse::end(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
    ;
    HttpResponse::~HttpResponse((HttpResponse *)0x1e08b6);
  }
  else if (in_RSI->method < 5) {
    iVar3 = auth((Httpd *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    if (iVar3 == 200) {
      if (in_RSI->method != 1) {
        this_00 = Base::config(*(Base **)(in_RDI + 0x10));
        this_01 = BaseConfig::http(&this_00->super_BaseConfig);
        bVar2 = Http::isRestricted(this_01);
        puVar1 = kContentType;
        if (bVar2) {
          HttpData::id(in_RSI);
          HttpApiResponse::HttpApiResponse
                    (in_stack_fffffffffffffbc0,(uint64_t)in_stack_fffffffffffffbb8,
                     (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          HttpApiResponse::end(in_stack_fffffffffffffe10);
          HttpApiResponse::~HttpApiResponse(in_stack_fffffffffffffba0);
          return;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_308,puVar1,&local_309);
        sVar4 = std::
                map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffbb0,
                        (key_type *)
                        CONCAT17(in_stack_fffffffffffffbaf,
                                 CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)));
        iVar3 = (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
        local_429 = 1;
        if (sVar4 != 0) {
          in_stack_fffffffffffffbb8 = (key_type *)&in_RSI->headers;
          in_stack_fffffffffffffbc0 = (HttpApiResponse *)kContentType;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_330,(char *)in_stack_fffffffffffffbc0,&local_331);
          pmVar5 = std::
                   map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          iVar3 = (int)((ulong)pmVar5 >> 0x20);
          local_429 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          std::__cxx11::string::~string(local_330);
          std::allocator<char>::~allocator((allocator<char> *)&local_331);
        }
        std::__cxx11::string::~string(local_308);
        std::allocator<char>::~allocator((allocator<char> *)&local_309);
        if ((local_429 & 1) != 0) {
          HttpData::id(in_RSI);
          this_02 = (HttpApiResponse *)&stack0xfffffffffffffc28;
          HttpApiResponse::HttpApiResponse
                    (in_stack_fffffffffffffbc0,(uint64_t)in_stack_fffffffffffffbb8,iVar3);
          HttpApiResponse::end(in_stack_fffffffffffffe10);
          HttpApiResponse::~HttpApiResponse(this_02);
          return;
        }
      }
      Base::api(*(Base **)(in_RDI + 0x10));
      Api::request(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    }
    else {
      HttpData::id(in_RSI);
      HttpApiResponse::HttpApiResponse
                (in_stack_fffffffffffffbc0,(uint64_t)in_stack_fffffffffffffbb8,
                 (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
      HttpApiResponse::end(in_stack_fffffffffffffe10);
      HttpApiResponse::~HttpApiResponse(in_stack_fffffffffffffba0);
    }
  }
  else {
    HttpData::id(in_RSI);
    HttpApiResponse::HttpApiResponse
              (in_stack_fffffffffffffbc0,(uint64_t)in_stack_fffffffffffffbb8,
               (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
    HttpApiResponse::end(in_stack_fffffffffffffe10);
    HttpApiResponse::~HttpApiResponse(in_stack_fffffffffffffba0);
  }
  return;
}

Assistant:

void xmrig::Httpd::onHttpData(const HttpData &data)
{
    if (data.method == HTTP_OPTIONS) {
        return HttpApiResponse(data.id()).end();
    }

    if (data.method == HTTP_GET && data.url == "/favicon.ico") {
#       ifdef _WIN32
        if (favicon != nullptr) {
            HttpResponse response(data.id());
            response.setHeader("Content-Type", "image/x-icon");

            return response.end(favicon, faviconSize);
        }
#       endif

        return HttpResponse(data.id(), 404).end();
    }

    if (data.method > 4) {
        return HttpApiResponse(data.id(), HTTP_STATUS_METHOD_NOT_ALLOWED).end();
    }

    const int status = auth(data);
    if (status != HTTP_STATUS_OK) {
        return HttpApiResponse(data.id(), status).end();
    }

    if (data.method != HTTP_GET) {
        if (m_base->config()->http().isRestricted()) {
            return HttpApiResponse(data.id(), HTTP_STATUS_FORBIDDEN).end();
        }

        if (!data.headers.count(kContentType) || data.headers.at(kContentType) != "application/json") {
            return HttpApiResponse(data.id(), HTTP_STATUS_UNSUPPORTED_MEDIA_TYPE).end();
        }
    }

    m_base->api()->request(data);
}